

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

string * lest::transformed_abi_cxx11_(char chr)

{
  char *pcVar1;
  char in_SIL;
  string *in_RDI;
  char in_stack_000000af;
  Tr *pos;
  Tr table [5];
  bool local_113;
  allocator local_111;
  string local_110 [39];
  byte local_e9;
  string local_e8 [32];
  string local_c8 [55];
  allocator local_91;
  string local_90 [32];
  char *local_70;
  char local_68 [80];
  char acStack_18 [15];
  char local_9;
  
  local_9 = in_SIL;
  memcpy(local_68,&DAT_0013cd50,0x50);
  local_70 = local_68;
  while( true ) {
    if (local_70 == acStack_18) {
      local_113 = unprintable(local_9);
      local_e9 = 0;
      if (local_113) {
        to_hex_string_abi_cxx11_(in_stack_000000af);
        local_e9 = 1;
        std::__cxx11::string::string(local_c8,local_e8);
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_110,1,local_9,&local_111);
        std::__cxx11::string::string(local_c8,local_110);
      }
      local_113 = !local_113;
      std::__cxx11::string::string(in_RDI,local_c8);
      std::__cxx11::string::~string(local_c8);
      if (local_113) {
        std::__cxx11::string::~string(local_110);
        std::allocator<char>::~allocator((allocator<char> *)&local_111);
      }
      if ((local_e9 & 1) != 0) {
        std::__cxx11::string::~string(local_e8);
      }
      return in_RDI;
    }
    if (local_9 == *local_70) break;
    local_70 = local_70 + 0x10;
  }
  pcVar1 = *(char **)(local_70 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,pcVar1,&local_91);
  std::__cxx11::string::string(in_RDI,local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  return in_RDI;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( Tr * pos = table; pos != table + lest_DIMENSION_OF( table ); ++pos )
    {
        if ( chr == pos->chr )
            return pos->str;
    }

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}